

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<std::__cxx11::string_const&>::operator>=
          (result *__return_storage_ptr__,expression_lhs<std::__cxx11::string_const&> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  lest *this_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  allocator<char> local_69;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar1 = std::operator>=(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           this,rhs);
  this_00 = *(lest **)this;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,">=",&local_69);
  to_string<std::__cxx11::string,std::__cxx11::string>(&local_68,this_00,&local_48,rhs,in_R8);
  __return_storage_ptr__->passed = bVar1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_68)
  ;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result{ lhs >  rhs, to_string( lhs, ">" , rhs ) }; }